

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O1

REF_STATUS ref_oct_split(REF_OCT ref_oct,REF_INT node)

{
  int iVar1;
  REF_INT *pRVar2;
  bool bVar3;
  int iVar4;
  REF_STATUS RVar5;
  REF_INT *pRVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  
  if (node < 0) {
    pcVar10 = "node negative";
    uVar8 = 0xa2;
LAB_0017ea55:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar8,
           "ref_oct_split",pcVar10);
    return 1;
  }
  if (ref_oct->n <= node) {
    pcVar10 = "node larger than n";
    uVar8 = 0xa3;
    goto LAB_0017ea55;
  }
  iVar1 = ref_oct->max;
  if (iVar1 <= node) {
    pcVar10 = "node larger than max";
    uVar8 = 0xa4;
    goto LAB_0017ea55;
  }
  lVar7 = 0;
  do {
    if ((long)ref_oct->children[(ulong)(uint)(node << 3) + lVar7] != -1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xa6,
             "ref_oct_split","child not empty",0xffffffffffffffff,
             (long)ref_oct->children[(ulong)(uint)(node << 3) + lVar7]);
      return 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  if (ref_oct->n + 8 <= iVar1) goto LAB_0017eb74;
  if (iVar1 < 0x4bda12f) {
    iVar4 = 0x4bda12f - iVar1;
    if ((int)((double)iVar1 * 1.5) <= 0x4bda12f - iVar1) {
      iVar4 = (int)((double)iVar1 * 1.5);
    }
    ref_oct->max = iVar4 + iVar1;
    fflush(_stdout);
    if (0 < ref_oct->max) {
      pRVar6 = (REF_INT *)realloc(ref_oct->children,(ulong)(uint)(ref_oct->max << 3) << 2);
      ref_oct->children = pRVar6;
    }
    if (ref_oct->children == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xb1,
             "ref_oct_split","realloc ref_oct->children NULL");
      uVar9 = (long)ref_oct->max * 8;
      lVar7 = (long)ref_oct->max << 5;
    }
    else {
      fflush(_stdout);
      if (0 < ref_oct->max) {
        pRVar6 = (REF_INT *)realloc(ref_oct->nodes,(ulong)(uint)ref_oct->max * 0x6c);
        ref_oct->nodes = pRVar6;
      }
      pRVar6 = ref_oct->nodes;
      if (pRVar6 != (REF_INT *)0x0) {
        if (iVar1 < ref_oct->max) {
          pRVar2 = ref_oct->children;
          lVar7 = (long)(iVar1 * 8);
          do {
            pRVar2[lVar7] = -1;
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)ref_oct->max * 8);
        }
        lVar7 = (long)iVar1 * 0x1b;
        RVar5 = 1;
        bVar3 = true;
        if ((int)lVar7 < ref_oct->max * 0x1b) {
          do {
            pRVar6[lVar7] = -1;
            lVar7 = lVar7 + 1;
          } while (lVar7 < (long)ref_oct->max * 0x1b);
        }
        goto LAB_0017eb6b;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xb2,
             "ref_oct_split","realloc ref_oct->nodes NULL");
      uVar9 = (long)ref_oct->max * 0x1b;
      lVar7 = (long)ref_oct->max * 0x6c;
    }
    bVar3 = false;
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar9 & 0xffffffff,uVar9,4,
           lVar7);
    RVar5 = 2;
  }
  else {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0xae,
           "ref_oct_split","chunk limit at max");
    RVar5 = 1;
  }
LAB_0017eb6b:
  if (!bVar3) {
    return RVar5;
  }
LAB_0017eb74:
  pRVar6 = ref_oct->children;
  lVar7 = 0;
  do {
    pRVar6[(ulong)(uint)(node << 3) + lVar7] = ref_oct->n;
    ref_oct->n = ref_oct->n + 1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_oct_split(REF_OCT ref_oct, REF_INT node) {
  REF_INT i;
  RAS(node >= 0, "node negative");
  RAS(node < ref_oct_n(ref_oct), "node larger than n");
  RAS(node < ref_oct_max(ref_oct), "node larger than max");
  for (i = 0; i < 8; i++) {
    REIS(REF_EMPTY, ref_oct_child(ref_oct, i, node), "child not empty");
  }
  if (ref_oct_n(ref_oct) + 8 > ref_oct_max(ref_oct)) {
    REF_INT orig, chunk;
    REF_INT max_limit = REF_INT_MAX / 27;
    orig = ref_oct_max(ref_oct);
    /* geometric growth for efficiency */
    chunk = (REF_INT)(1.5 * (REF_DBL)orig);
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);
    ref_oct_max(ref_oct) = orig + chunk;
    ref_realloc(ref_oct->children, 8 * ref_oct->max, REF_INT);
    ref_realloc(ref_oct->nodes, 27 * ref_oct->max, REF_INT);
    for (i = 8 * orig; i < 8 * ref_oct_max(ref_oct); i++)
      ref_oct->children[i] = REF_EMPTY;
    for (i = 27 * orig; i < 27 * ref_oct_max(ref_oct); i++)
      ref_oct->nodes[i] = REF_EMPTY;
  }
  for (i = 0; i < 8; i++) {
    ref_oct_child(ref_oct, i, node) = ref_oct_n(ref_oct);
    (ref_oct_n(ref_oct))++;
  }
  return REF_SUCCESS;
}